

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O0

Vector2f __thiscall
sf::RenderTarget::mapPixelToCoords(RenderTarget *this,Vector2i *point,View *view)

{
  Transform *this_00;
  float fVar1;
  Vector2f VVar2;
  IntRect IVar3;
  int local_40;
  int iStack_3c;
  IntRect viewport;
  Vector2f normalized;
  View *view_local;
  Vector2i *point_local;
  RenderTarget *this_local;
  
  Vector2<float>::Vector2((Vector2<float> *)&viewport.width);
  IVar3 = getViewport(this,view);
  local_40 = IVar3.left;
  fVar1 = (float)(point->x - local_40);
  viewport.left = IVar3.width;
  viewport.width = (int)((fVar1 + fVar1) / (float)viewport.left + -1.0);
  iStack_3c = IVar3.top;
  fVar1 = (float)(point->y - iStack_3c);
  viewport.top = IVar3.height;
  viewport.height = (int)(1.0 - (fVar1 + fVar1) / (float)viewport.top);
  this_00 = View::getInverseTransform(view);
  VVar2 = Transform::transformPoint(this_00,(Vector2f *)&viewport.width);
  return VVar2;
}

Assistant:

Vector2f RenderTarget::mapPixelToCoords(const Vector2i& point, const View& view) const
{
    // First, convert from viewport coordinates to homogeneous coordinates
    Vector2f normalized;
    IntRect viewport = getViewport(view);
    normalized.x = -1.f + 2.f * (point.x - viewport.left) / viewport.width;
    normalized.y =  1.f - 2.f * (point.y - viewport.top)  / viewport.height;

    // Then transform by the inverse of the view matrix
    return view.getInverseTransform().transformPoint(normalized);
}